

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quantize.c
# Opt level: O3

void aom_quantize_b_helper_c
               (tran_low_t *coeff_ptr,intptr_t n_coeffs,int16_t *zbin_ptr,int16_t *round_ptr,
               int16_t *quant_ptr,int16_t *quant_shift_ptr,tran_low_t *qcoeff_ptr,
               tran_low_t *dqcoeff_ptr,int16_t *dequant_ptr,uint16_t *eob_ptr,int16_t *scan,
               int16_t *iscan,qm_val_t *qm_ptr,qm_val_t *iqm_ptr,int log_scale)

{
  short sVar1;
  uint uVar2;
  ulong uVar3;
  byte bVar4;
  byte bVar5;
  uint16_t uVar6;
  int iVar7;
  uint uVar8;
  ulong uVar9;
  int iVar10;
  int iVar11;
  uint uVar12;
  uint uVar13;
  bool bVar14;
  undefined4 local_60;
  int local_58 [4];
  int16_t *local_48;
  int16_t *local_40;
  int16_t *local_38;
  
  bVar4 = (byte)log_scale;
  iVar11 = (1 << (bVar4 & 0x1f)) >> 1;
  local_58[0] = *zbin_ptr + iVar11 >> (bVar4 & 0x1f);
  local_58[2] = -local_58[0];
  local_58[1] = zbin_ptr[1] + iVar11 >> (bVar4 & 0x1f);
  local_58[3] = -local_58[1];
  local_48 = round_ptr;
  local_40 = quant_ptr;
  local_38 = quant_shift_ptr;
  memset(qcoeff_ptr,0,n_coeffs * 4);
  memset(dqcoeff_ptr,0,n_coeffs * 4);
  uVar3 = n_coeffs & 0xffffffff;
  do {
    uVar2 = (uint)uVar3;
    if ((int)uVar2 < 1) {
      uVar6 = 0;
      goto LAB_00266047;
    }
    sVar1 = scan[uVar3 - 1];
    if (qm_ptr == (qm_val_t *)0x0) {
      uVar12 = 0x20;
    }
    else {
      uVar12 = (uint)qm_ptr[sVar1];
    }
    iVar7 = uVar12 * coeff_ptr[sVar1];
  } while ((iVar7 < local_58[sVar1 != 0] * 0x20) &&
          (uVar3 = uVar3 - 1,
          iVar7 + local_58[(ulong)(sVar1 != 0) + 2] * -0x20 != 0 &&
          local_58[(ulong)(sVar1 != 0) + 2] * 0x20 <= iVar7));
  local_60 = 0xffffffff;
  uVar3 = 0;
  do {
    sVar1 = scan[uVar3];
    iVar7 = coeff_ptr[sVar1];
    iVar10 = -iVar7;
    if (0 < iVar7) {
      iVar10 = iVar7;
    }
    if (qm_ptr == (qm_val_t *)0x0) {
      bVar5 = 0x20;
    }
    else {
      bVar5 = qm_ptr[sVar1];
    }
    bVar14 = sVar1 != 0;
    if (local_58[bVar14] * 0x20 <= (int)(iVar10 * (uint)bVar5)) {
      uVar9 = (ulong)((uint)bVar14 * 2);
      iVar10 = (*(short *)((long)local_48 + uVar9) + iVar11 >> (bVar4 & 0x1f)) + iVar10;
      if (0x7ffe < iVar10) {
        iVar10 = 0x7fff;
      }
      if (iVar10 < -0x7fff) {
        iVar10 = -0x8000;
      }
      uVar12 = iVar7 >> 0x1f;
      uVar13 = (uint)((long)((long)*(short *)((long)local_38 + uVar9) *
                            (((long)((long)*(short *)((long)local_40 + uVar9) *
                                    (ulong)bVar5 * (long)iVar10) >> 0x10) +
                            (ulong)bVar5 * (long)iVar10)) >> (0x15 - bVar4 & 0x3f));
      qcoeff_ptr[sVar1] = (uVar12 ^ uVar13) - uVar12;
      if (iqm_ptr == (qm_val_t *)0x0) {
        uVar8 = 0x20;
      }
      else {
        uVar8 = (uint)iqm_ptr[sVar1];
      }
      dqcoeff_ptr[sVar1] =
           ((int)(((int)((int)dequant_ptr[bVar14] * uVar8 + 0x10) >> 5) * uVar13) >> (bVar4 & 0x1f)
           ^ uVar12) - uVar12;
      if (uVar13 != 0) {
        local_60 = (undefined4)uVar3;
      }
    }
    uVar3 = uVar3 + 1;
  } while ((uVar2 & 0x7fffffff) != uVar3);
  uVar6 = (short)local_60 + 1;
LAB_00266047:
  *eob_ptr = uVar6;
  return;
}

Assistant:

void aom_quantize_b_helper_c(const tran_low_t *coeff_ptr, intptr_t n_coeffs,
                             const int16_t *zbin_ptr, const int16_t *round_ptr,
                             const int16_t *quant_ptr,
                             const int16_t *quant_shift_ptr,
                             tran_low_t *qcoeff_ptr, tran_low_t *dqcoeff_ptr,
                             const int16_t *dequant_ptr, uint16_t *eob_ptr,
                             const int16_t *scan, const int16_t *iscan,
                             const qm_val_t *qm_ptr, const qm_val_t *iqm_ptr,
                             const int log_scale) {
  const int zbins[2] = { ROUND_POWER_OF_TWO(zbin_ptr[0], log_scale),
                         ROUND_POWER_OF_TWO(zbin_ptr[1], log_scale) };
  const int nzbins[2] = { zbins[0] * -1, zbins[1] * -1 };
  int i, non_zero_count = (int)n_coeffs, eob = -1;
  (void)iscan;

  memset(qcoeff_ptr, 0, n_coeffs * sizeof(*qcoeff_ptr));
  memset(dqcoeff_ptr, 0, n_coeffs * sizeof(*dqcoeff_ptr));

  // Pre-scan pass
  for (i = (int)n_coeffs - 1; i >= 0; i--) {
    const int rc = scan[i];
    const qm_val_t wt = qm_ptr != NULL ? qm_ptr[rc] : (1 << AOM_QM_BITS);
    const int coeff = coeff_ptr[rc] * wt;

    if (coeff < (zbins[rc != 0] * (1 << AOM_QM_BITS)) &&
        coeff > (nzbins[rc != 0] * (1 << AOM_QM_BITS)))
      non_zero_count--;
    else
      break;
  }

  // Quantization pass: All coefficients with index >= zero_flag are
  // skippable. Note: zero_flag can be zero.
  for (i = 0; i < non_zero_count; i++) {
    const int rc = scan[i];
    const int coeff = coeff_ptr[rc];
    const int coeff_sign = AOMSIGN(coeff);
    const int abs_coeff = (coeff ^ coeff_sign) - coeff_sign;
    int tmp32;

    const qm_val_t wt = qm_ptr != NULL ? qm_ptr[rc] : (1 << AOM_QM_BITS);
    if (abs_coeff * wt >= (zbins[rc != 0] << AOM_QM_BITS)) {
      int64_t tmp =
          clamp(abs_coeff + ROUND_POWER_OF_TWO(round_ptr[rc != 0], log_scale),
                INT16_MIN, INT16_MAX);
      tmp *= wt;
      tmp32 = (int)(((((tmp * quant_ptr[rc != 0]) >> 16) + tmp) *
                     quant_shift_ptr[rc != 0]) >>
                    (16 - log_scale + AOM_QM_BITS));  // quantization
      qcoeff_ptr[rc] = (tmp32 ^ coeff_sign) - coeff_sign;
      const int iwt = iqm_ptr != NULL ? iqm_ptr[rc] : (1 << AOM_QM_BITS);
      const int dequant =
          (dequant_ptr[rc != 0] * iwt + (1 << (AOM_QM_BITS - 1))) >>
          AOM_QM_BITS;
      const tran_low_t abs_dqcoeff = (tmp32 * dequant) >> log_scale;
      dqcoeff_ptr[rc] = (tran_low_t)((abs_dqcoeff ^ coeff_sign) - coeff_sign);

      if (tmp32) eob = i;
    }
  }
  *eob_ptr = eob + 1;
}